

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MemFile * memdbFromDbSchema(sqlite3 *db,char *zSchema)

{
  long lVar1;
  MemStore *pMVar2;
  int iVar3;
  void *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int rc;
  MemStore *pStore;
  MemFile *p;
  char *in_stack_ffffffffffffffe8;
  MemFile *pMVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar4 = (MemFile *)0x0;
  iVar3 = sqlite3_file_control
                    ((sqlite3 *)0x0,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20),in_RSI);
  if (iVar3 == 0) {
    if ((pMVar4->base).pMethods == &memdb_io_methods) {
      pMVar2 = pMVar4->pStore;
      memdbEnter((MemStore *)0x13a3c7);
      if (pMVar2->zFName != (char *)0x0) {
        pMVar4 = (MemFile *)0x0;
      }
      memdbLeave((MemStore *)0x13a3e6);
    }
    else {
      pMVar4 = (MemFile *)0x0;
    }
  }
  else {
    pMVar4 = (MemFile *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pMVar4;
  }
  __stack_chk_fail();
}

Assistant:

static MemFile *memdbFromDbSchema(sqlite3 *db, const char *zSchema){
  MemFile *p = 0;
  MemStore *pStore;
  int rc = sqlite3_file_control(db, zSchema, SQLITE_FCNTL_FILE_POINTER, &p);
  if( rc ) return 0;
  if( p->base.pMethods!=&memdb_io_methods ) return 0;
  pStore = p->pStore;
  memdbEnter(pStore);
  if( pStore->zFName!=0 ) p = 0;
  memdbLeave(pStore);
  return p;
}